

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O0

void CheckConstraintViolation(string *result_str)

{
  StringRef capturedExpression;
  long lVar1;
  AssertionHandler *pAVar2;
  char *in_RDI;
  AssertionHandler catchAssertionHandler;
  bool constraint_violation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  string *stdString;
  SourceLineInfo *in_stack_fffffffffffffef0;
  StringRef *in_stack_fffffffffffffef8;
  char *pcVar3;
  size_type sVar4;
  bool local_e6;
  string local_b8 [32];
  string local_98;
  AssertionHandler local_78;
  bool local_9;
  char *local_8;
  
  local_8 = in_RDI;
  lVar1 = std::__cxx11::string::find(in_RDI,0x8bc605);
  local_e6 = true;
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find(local_8,0x8bc60c);
    local_e6 = lVar1 != -1;
  }
  local_9 = local_e6;
  if (local_e6 == false) {
    local_78.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr((char *)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    pAVar2 = &local_78;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)pAVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
               ,0x1b);
    pcVar3 = (char *)0x0;
    sVar4 = 0;
    local_98.field_2._M_allocated_capacity = 0;
    local_98.field_2._8_8_ = 0;
    Catch::StringRef::StringRef((StringRef *)&local_98.field_2);
    capturedExpression.m_size = sVar4;
    capturedExpression.m_start = pcVar3;
    Catch::AssertionHandler::AssertionHandler
              (pAVar2,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,capturedExpression,
               (Flags)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    Catch::MessageStream::MessageStream((MessageStream *)0x785b9f);
    Catch::operator+(local_8);
    pAVar2 = (AssertionHandler *)
             Catch::MessageStream::operator<<
                       ((MessageStream *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    Catch::ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffee8);
    stdString = &local_98;
    Catch::StringRef::StringRef((StringRef *)pAVar2,stdString);
    Catch::AssertionHandler::handleMessage
              (pAVar2,(OfType)((ulong)stdString >> 0x20),(StringRef *)0x785c08);
    std::__cxx11::string::~string(local_b8);
    Catch::MessageStream::~MessageStream((MessageStream *)0x785c1e);
    Catch::AssertionHandler::complete(pAVar2);
    Catch::AssertionHandler::~AssertionHandler(pAVar2);
  }
  return;
}

Assistant:

static void CheckConstraintViolation(const string &result_str) {
	auto constraint_violation =
	    result_str.find("violat") != string::npos || result_str.find("Conflict on tuple deletion") != string::npos;
	if (!constraint_violation) {
		FAIL(result_str);
	}
}